

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementFormControlTextArea.cpp
# Opt level: O2

void __thiscall
Rml::ElementFormControlTextArea::OnAttributeChange
          (ElementFormControlTextArea *this,ElementAttributes *changed_attributes)

{
  WidgetTextInput *pWVar1;
  int _max_length;
  const_iterator cVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  ElementFormControl::OnAttributeChange(&this->super_ElementFormControl,changed_attributes);
  cVar2 = itlib::
          flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
          ::find<char[5]>(changed_attributes,(char (*) [5])0x3269f6);
  if (cVar2._M_current !=
      (changed_attributes->m_container).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    SetWordWrapProperties(this);
  }
  cVar2 = itlib::
          flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
          ::find<char[5]>(changed_attributes,(char (*) [5])"rows");
  if (cVar2._M_current ==
      (changed_attributes->m_container).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    cVar2 = itlib::
            flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
            ::find<char[5]>(changed_attributes,(char (*) [5])"cols");
    if (cVar2._M_current ==
        (changed_attributes->m_container).
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_002f315b;
  }
  (*(this->super_ElementFormControl).super_Element.super_ScriptInterface.super_Releasable.
    _vptr_Releasable[0x15])(this);
LAB_002f315b:
  cVar2 = itlib::
          flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
          ::find<char[10]>(changed_attributes,(char (*) [10])"maxlength");
  if (cVar2._M_current !=
      (changed_attributes->m_container).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pWVar1 = &((this->widget)._M_t.
               super___uniq_ptr_impl<Rml::WidgetTextInputMultiLine,_std::default_delete<Rml::WidgetTextInputMultiLine>_>
               ._M_t.
               super__Tuple_impl<0UL,_Rml::WidgetTextInputMultiLine_*,_std::default_delete<Rml::WidgetTextInputMultiLine>_>
               .super__Head_base<0UL,_Rml::WidgetTextInputMultiLine_*,_false>._M_head_impl)->
              super_WidgetTextInput;
    _max_length = Variant::Get<int>(&(cVar2._M_current)->second,-1);
    WidgetTextInput::SetMaxLength(pWVar1,_max_length);
  }
  cVar2 = itlib::
          flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
          ::find<char[6]>(changed_attributes,(char (*) [6])0x31c259);
  if (cVar2._M_current !=
      (changed_attributes->m_container).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pWVar1 = &((this->widget)._M_t.
               super___uniq_ptr_impl<Rml::WidgetTextInputMultiLine,_std::default_delete<Rml::WidgetTextInputMultiLine>_>
               ._M_t.
               super__Tuple_impl<0UL,_Rml::WidgetTextInputMultiLine_*,_std::default_delete<Rml::WidgetTextInputMultiLine>_>
               .super__Head_base<0UL,_Rml::WidgetTextInputMultiLine_*,_false>._M_head_impl)->
              super_WidgetTextInput;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    Variant::Get<std::__cxx11::string>(&local_38,&(cVar2._M_current)->second,&local_58);
    WidgetTextInput::SetValue(pWVar1,&local_38);
    ::std::__cxx11::string::~string((string *)&local_38);
    ::std::__cxx11::string::~string((string *)&local_58);
  }
  return;
}

Assistant:

void ElementFormControlTextArea::OnAttributeChange(const ElementAttributes& changed_attributes)
{
	ElementFormControl::OnAttributeChange(changed_attributes);

	if (changed_attributes.find("wrap") != changed_attributes.end())
		SetWordWrapProperties();

	if (changed_attributes.find("rows") != changed_attributes.end() || changed_attributes.find("cols") != changed_attributes.end())
		DirtyLayout();

	auto it = changed_attributes.find("maxlength");
	if (it != changed_attributes.end())
		widget->SetMaxLength(it->second.Get(-1));

	it = changed_attributes.find("value");
	if (it != changed_attributes.end())
		widget->SetValue(it->second.Get<String>());
}